

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O3

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  bool bVar1;
  byte *__nptr;
  char cVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  size_t maxlength;
  char *pcVar14;
  long lVar15;
  byte *pbVar16;
  int *piVar17;
  ulong *puVar18;
  undefined8 *puVar19;
  ulong uVar20;
  uint *puVar21;
  byte bVar22;
  undefined4 *puVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  bool bVar27;
  bool bVar28;
  char formatbuf [32];
  char work [256];
  va_stack_t vto [128];
  char *endpos [128];
  char *local_15a0;
  long local_1590;
  char *local_1578;
  long local_1570;
  char *local_1560;
  byte local_1558 [32];
  undefined8 local_1538;
  byte local_1439;
  undefined4 local_1438;
  undefined4 uStack_1434;
  undefined1 auStack_1430 [8];
  undefined8 uStack_1428;
  ulong uStack_1420;
  ulong auStack_1418 [508];
  undefined8 local_438 [129];
  
  bVar22 = *format;
  local_1538 = (byte *)format;
  if (bVar22 != 0) {
    puVar19 = local_438;
    local_1578 = (char *)0x0;
    iVar25 = 0;
LAB_001022c2:
    pbVar16 = local_1538 + 1;
    while (bVar22 == 0x25) {
      if (*pbVar16 != 0x25) {
        iVar25 = iVar25 + 1;
        local_1538 = pbVar16;
        lVar6 = dprintf_DollarString((char *)pbVar16,(char **)&local_1538);
        lVar13 = (long)iVar25;
        if (lVar6 != 0) {
          lVar13 = lVar6;
        }
        if ((long)local_1578 < lVar13) {
          local_1578 = (char *)lVar13;
        }
        lVar6 = 0;
        local_1590 = 0;
        uVar26 = 0;
        pbVar16 = local_1538;
        goto switchD_0010236a_caseD_1;
      }
      bVar22 = pbVar16[1];
      pbVar16 = pbVar16 + 2;
      if (bVar22 == 0) goto LAB_001027f6;
    }
    goto LAB_001027ec;
  }
  goto LAB_001029a2;
switchD_0010236a_caseD_1:
  local_1538 = pbVar16;
  __nptr = local_1538;
  bVar22 = *local_1538;
  uVar12 = bVar22 - 0x20;
  if (((0x2f < uVar12) || ((0x900003ff6c09U >> ((ulong)uVar12 & 0x3f) & 1) == 0)) &&
     ((0x12 < bVar22 - 0x68 || ((0x40211U >> (bVar22 - 0x68 & 0x1f) & 1) == 0)))) goto LAB_0010250d;
  pbVar16 = local_1538 + 1;
  if (bVar22 < 0x4c) {
    switch((ulong)uVar12) {
    case 0:
      uVar26 = uVar26 | 1;
      break;
    case 3:
      uVar26 = uVar26 | 8;
      break;
    case 10:
      uVar26 = uVar26 | 0x4000;
      iVar25 = iVar25 + 1;
      local_1538 = pbVar16;
      lVar5 = dprintf_DollarString((char *)pbVar16,(char **)&local_1538);
      lVar6 = (long)iVar25;
      if (lVar5 != 0) {
        lVar6 = lVar5;
      }
      pbVar16 = local_1538;
      if ((long)local_1578 < lVar6) {
        local_1578 = (char *)lVar6;
      }
      break;
    case 0xb:
      uVar26 = uVar26 | 2;
      break;
    case 0xd:
      uVar26 = uVar26 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*pbVar16 == 0x2a) {
        uVar26 = uVar26 | 0x18000;
        local_1538 = local_1538 + 2;
        iVar25 = iVar25 + 1;
        lVar5 = dprintf_DollarString((char *)local_1538,(char **)&local_1538);
        local_1590 = (long)iVar25;
        if (lVar5 != 0) {
          local_1590 = lVar5;
        }
        pbVar16 = local_1538;
        if ((long)local_1578 < local_1590) {
          local_1578 = (char *)local_1590;
        }
      }
      else {
        uVar26 = uVar26 | 0x8000;
        local_1538 = pbVar16;
        local_1590 = strtol((char *)pbVar16,(char **)&local_1538,10);
        pbVar16 = local_1538;
      }
      break;
    case 0x10:
      uVar26 = uVar26 | (~uVar26 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar26 = uVar26 | 0x2000;
      local_1538 = pbVar16;
      lVar6 = strtol((char *)__nptr,(char **)&local_1538,10);
      pbVar16 = local_1538;
    }
  }
  else if (bVar22 < 0x6c) {
    if (bVar22 == 0x4c) {
      uVar26 = uVar26 | 0x80;
    }
    else if (bVar22 == 0x4f) {
LAB_001024da:
      uVar26 = uVar26 | 0x20;
    }
    else if (bVar22 == 0x68) {
      uVar26 = uVar26 | 0x10;
    }
  }
  else {
    if (bVar22 == 0x6c) {
      if ((uVar26 & 0x20) != 0) goto LAB_001024e3;
      goto LAB_001024da;
    }
    if (bVar22 == 0x71) {
LAB_001024e3:
      uVar26 = uVar26 | 0x40;
    }
    else if (bVar22 == 0x7a) goto LAB_001024da;
  }
  goto switchD_0010236a_caseD_1;
LAB_0010250d:
  lVar13 = lVar13 + -1;
  if (bVar22 < 0x58) {
    if (bVar22 == 0x45) {
      (&local_1438)[lVar13 * 8] = 7;
      uVar26 = uVar26 | 0x41000;
      goto LAB_00102733;
    }
    if (bVar22 == 0x47) {
      (&local_1438)[lVar13 * 8] = 7;
      uVar26 = uVar26 | 0x81000;
      goto LAB_00102733;
    }
    if (bVar22 == 0x53) {
      uVar26 = uVar26 | 8;
      goto switchD_00102539_caseD_73;
    }
    goto switchD_00102539_caseD_68;
  }
  switch(bVar22) {
  case 99:
    (&local_1438)[lVar13 * 8] = 3;
    uVar26 = uVar26 | 0x20000;
    break;
  case 100:
  case 0x69:
    (&local_1438)[lVar13 * 8] = 3;
    break;
  case 0x65:
    (&local_1438)[lVar13 * 8] = 7;
    uVar26 = uVar26 | 0x40000;
    break;
  case 0x66:
    (&local_1438)[lVar13 * 8] = 7;
    break;
  case 0x67:
    (&local_1438)[lVar13 * 8] = 7;
    uVar26 = uVar26 | 0x80000;
    break;
  case 0x6e:
    (&local_1438)[lVar13 * 8] = 4;
    break;
  case 0x6f:
    (&local_1438)[lVar13 * 8] = 3;
    uVar26 = uVar26 | 0x400;
    break;
  case 0x70:
    (&local_1438)[lVar13 * 8] = 2;
    break;
  case 0x73:
switchD_00102539_caseD_73:
    (&local_1438)[lVar13 * 8] = 1;
    break;
  case 0x75:
    (&local_1438)[lVar13 * 8] = 3;
    uVar26 = uVar26 | 0x200;
    break;
  case 0x78:
    (&local_1438)[lVar13 * 8] = 3;
    uVar26 = uVar26 | 0x800;
    break;
  default:
    if (bVar22 == 0x58) {
      (&local_1438)[lVar13 * 8] = 3;
      uVar26 = uVar26 | 0x1800;
      break;
    }
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_00102539_caseD_68:
    (&local_1438)[lVar13 * 8] = 0;
  }
LAB_00102733:
  lVar5 = lVar13 * 0x20;
  *(uint *)(auStack_1430 + lVar5 + -4) = uVar26;
  *(long *)(auStack_1430 + lVar5) = lVar6;
  (&uStack_1428)[lVar13 * 4] = local_1590;
  if ((uVar26 >> 0xe & 1) != 0) {
    lVar13 = lVar6 + -1;
    *(long *)(auStack_1430 + lVar5) = lVar13;
    lVar6 = lVar13 * 0x20;
    (&local_1438)[lVar13 * 8] = 9;
    *(undefined8 *)(auStack_1430 + lVar6 + -4) = 0;
    *(undefined8 *)(auStack_1430 + lVar6 + 4) = 0;
    *(undefined4 *)((long)&uStack_1428 + lVar6 + 4) = 0;
  }
  if ((uVar26 >> 0x10 & 1) != 0) {
    local_1590 = local_1590 + -1;
    (&uStack_1428)[lVar13 * 4] = local_1590;
    lVar13 = local_1590 * 0x20;
    (&local_1438)[local_1590 * 8] = 9;
    *(undefined8 *)(auStack_1430 + lVar13 + -4) = 0;
    *(undefined8 *)(auStack_1430 + lVar13 + 4) = 0;
    *(undefined4 *)((long)&uStack_1428 + lVar13 + 4) = 0;
  }
  *puVar19 = local_1538 + 1;
  puVar19 = puVar19 + 1;
  pbVar16 = local_1538;
LAB_001027ec:
  local_1538 = pbVar16;
  bVar22 = *local_1538;
  if (bVar22 == 0) goto LAB_001027f6;
  goto LAB_001022c2;
LAB_001027f6:
  if (0 < (long)local_1578) {
    puVar23 = &local_1438;
    lVar13 = 1;
    do {
      if ((lVar13 < (long)local_1578) && (puVar23[8] == 9)) {
        uVar26 = ap_save->gp_offset;
        if ((ulong)uVar26 < 0x29) {
          piVar17 = (int *)((ulong)uVar26 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar26 + 8;
        }
        else {
          piVar17 = (int *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = piVar17 + 2;
        }
        *(long *)(puVar23 + 0xe) = (long)*piVar17;
      }
      switch(*puVar23) {
      case 0:
      case 1:
      case 2:
      case 4:
switchD_00102866_caseD_0:
        uVar26 = ap_save->gp_offset;
        if ((ulong)uVar26 < 0x29) {
          puVar18 = (ulong *)((ulong)uVar26 + (long)ap_save->reg_save_area);
          ap_save->gp_offset = uVar26 + 8;
        }
        else {
          puVar18 = (ulong *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = puVar18 + 1;
        }
        uVar20 = *puVar18;
        goto LAB_00102890;
      case 3:
        uVar26 = puVar23[1];
        if ((((~uVar26 & 0x240) == 0) || ((uVar26 & 0x40) != 0)) || ((~uVar26 & 0x220) == 0))
        goto switchD_00102866_caseD_0;
        uVar12 = ap_save->gp_offset;
        uVar20 = (ulong)uVar12;
        if ((uVar26 & 0x20) == 0) {
          if ((uVar26 >> 9 & 1) == 0) {
            if (uVar12 < 0x29) {
              piVar17 = (int *)(uVar20 + (long)ap_save->reg_save_area);
              ap_save->gp_offset = uVar12 + 8;
            }
            else {
              piVar17 = (int *)ap_save->overflow_arg_area;
              ap_save->overflow_arg_area = piVar17 + 2;
            }
            uVar20 = (ulong)*piVar17;
          }
          else {
            if (uVar12 < 0x29) {
              puVar21 = (uint *)(uVar20 + (long)ap_save->reg_save_area);
              ap_save->gp_offset = uVar12 + 8;
            }
            else {
              puVar21 = (uint *)ap_save->overflow_arg_area;
              ap_save->overflow_arg_area = puVar21 + 2;
            }
            uVar20 = (ulong)*puVar21;
          }
        }
        else {
          if (uVar12 < 0x29) {
            puVar18 = (ulong *)(uVar20 + (long)ap_save->reg_save_area);
            ap_save->gp_offset = uVar12 + 8;
          }
          else {
            puVar18 = (ulong *)ap_save->overflow_arg_area;
            ap_save->overflow_arg_area = puVar18 + 1;
          }
          uVar20 = *puVar18;
        }
LAB_00102890:
        *(ulong *)(puVar23 + 6) = uVar20;
        break;
      case 7:
        uVar26 = ap_save->fp_offset;
        if ((ulong)uVar26 < 0xa1) {
          puVar19 = (undefined8 *)((ulong)uVar26 + (long)ap_save->reg_save_area);
          ap_save->fp_offset = uVar26 + 0x10;
        }
        else {
          puVar19 = (undefined8 *)ap_save->overflow_arg_area;
          ap_save->overflow_arg_area = puVar19 + 1;
        }
        *(undefined8 *)(puVar23 + 6) = *puVar19;
        break;
      case 9:
        *puVar23 = 3;
      }
      puVar23 = puVar23 + 8;
      bVar27 = (char *)lVar13 != local_1578;
      lVar13 = lVar13 + 1;
    } while (bVar27);
  }
LAB_001029a2:
  puVar19 = local_438;
  local_1570 = 0;
  iVar25 = 0;
  local_1578 = "0123456789abcdefghijklmnopqrstuvwxyz";
  pcVar14 = format;
  do {
    while( true ) {
      while( true ) {
        local_1560 = pcVar14;
        cVar2 = *format;
        if (cVar2 == '%') break;
        if (cVar2 == '\0') {
          return iVar25;
        }
        do {
          iVar3 = (*stream)((int)cVar2,(FILE *)data);
          if (iVar3 == -1) {
            return iVar25;
          }
          iVar25 = iVar25 + 1;
          cVar2 = format[1];
          format = format + 1;
          pcVar14 = format;
        } while ((cVar2 != '\0') && (pcVar14 = format, cVar2 != '%'));
      }
      local_1560 = format + 1;
      if (format[1] != '%') break;
      format = format + 2;
      local_1560 = format;
      iVar3 = (*stream)(0x25,(FILE *)data);
      if (iVar3 == -1) {
        return iVar25;
      }
      iVar25 = iVar25 + 1;
      pcVar14 = local_1560;
    }
    lVar6 = dprintf_DollarString(local_1560,&local_1560);
    lVar13 = lVar6 + -1;
    if (lVar6 == 0) {
      lVar13 = local_1570;
    }
    lVar6 = lVar13 * 0x20;
    puVar18 = (ulong *)(auStack_1430 + lVar6);
    uVar26 = *(uint *)(auStack_1430 + lVar6 + -4);
    if ((uVar26 >> 0xe & 1) != 0) {
      puVar18 = auStack_1418 + *puVar18 * 4 + -1;
    }
    uVar20 = *puVar18;
    if ((uVar26 >> 0x10 & 1) == 0) {
      local_1570 = local_1570 + 1;
      uVar24 = 0xffffffffffffffff;
      if ((short)uVar26 < 0) {
        uVar24 = (&uStack_1428)[lVar13 * 4];
      }
    }
    else {
      uVar24 = auStack_1418[(&uStack_1428)[lVar13 * 4] * 4 + -1];
      local_1570 = local_1570 + 2;
    }
    iVar3 = (int)uVar20;
    iVar4 = iVar25;
    switch((&local_1438)[lVar13 * 8]) {
    case 1:
      local_15a0 = (char *)auStack_1418[lVar13 * 4 + -1];
      if (local_15a0 == (char *)0x0) {
        if (uVar24 == 0xffffffffffffffff || 4 < (long)uVar24) {
          uVar26 = uVar26 & 0xfffffff7;
          *(uint *)(auStack_1430 + lVar6 + -4) = uVar26;
          uVar7 = 5;
          local_15a0 = "(nil)";
        }
        else {
          local_15a0 = "";
          uVar7 = 0;
        }
      }
      else {
        uVar7 = strlen(local_15a0);
      }
      uVar11 = uVar7;
      if (uVar24 < uVar7) {
        uVar11 = uVar24;
      }
      if (uVar24 == 0xffffffffffffffff) {
        uVar11 = uVar7;
      }
      if ((uVar26 & 8) != 0) {
        iVar4 = (*stream)(0x22,(FILE *)data);
        if (iVar4 == -1) {
          return iVar25;
        }
        iVar25 = iVar25 + 1;
        uVar26 = *(uint *)(auStack_1430 + lVar6 + -4);
      }
      lVar13 = uVar20 - uVar11;
      if ((uVar26 & 4) == 0) {
        if (lVar13 < 1) {
          lVar13 = lVar13 + -1;
        }
        else {
          iVar3 = iVar3 + iVar25;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) {
              return iVar25;
            }
            iVar25 = iVar25 + 1;
            lVar5 = lVar13 + -1;
            bVar27 = 0 < lVar13;
            lVar13 = lVar5;
          } while (lVar5 != 0 && bVar27);
          lVar13 = -1;
          iVar25 = iVar3 - (int)uVar11;
        }
      }
      iVar4 = iVar25;
      if (uVar11 != 0) {
        iVar4 = iVar25 + (int)uVar11;
        uVar20 = 0;
        do {
          iVar3 = (*stream)((int)local_15a0[uVar20],(FILE *)data);
          if (iVar3 == -1) {
            return iVar25 + (int)uVar20;
          }
          uVar20 = uVar20 + 1;
        } while (uVar11 != uVar20);
      }
      uVar26 = *(uint *)(auStack_1430 + lVar6 + -4);
      if (((uVar26 & 4) != 0) && (0 < lVar13)) {
        iVar25 = iVar4 + (int)lVar13;
        lVar13 = lVar13 + 1;
        do {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar4;
          }
          iVar4 = iVar4 + 1;
          lVar13 = lVar13 + -1;
        } while (1 < lVar13);
        uVar26 = *(uint *)(auStack_1430 + lVar6 + -4);
        iVar4 = iVar25;
      }
      if ((uVar26 & 8) != 0) {
        iVar25 = (*stream)(0x22,(FILE *)data);
        if (iVar25 == -1) {
          return iVar4;
        }
        iVar4 = iVar4 + 1;
      }
      break;
    case 2:
      uVar7 = auStack_1418[lVar13 * 4 + -1];
      if (uVar7 == 0) {
        if ((uVar26 & 4) == 0) {
          lVar13 = uVar20 - 5;
        }
        else if ((long)uVar20 < 6) {
          lVar13 = uVar20 - 6;
        }
        else {
          iVar3 = iVar25 + iVar3;
          lVar13 = uVar20 - 5;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) {
              return iVar25;
            }
            iVar25 = iVar25 + 1;
            lVar13 = lVar13 + -1;
          } while (0 < lVar13);
          lVar13 = -1;
          iVar25 = iVar3 + -5;
        }
        iVar3 = iVar25 + 5;
        cVar2 = '(';
        lVar5 = 0;
        do {
          iVar4 = (*stream)((int)cVar2,(FILE *)data);
          if (iVar4 == -1) {
            return iVar25 + (int)lVar5;
          }
          cVar2 = "(nil)"[lVar5 + 1];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 5);
        iVar4 = iVar3;
        if (((auStack_1430[lVar6 + -4] & 4) == 0) && (0 < lVar13)) {
          iVar4 = iVar3 + (int)lVar13;
          lVar13 = lVar13 + 1;
          do {
            iVar25 = (*stream)(0x20,(FILE *)data);
            if (iVar25 == -1) {
              return iVar3;
            }
            iVar3 = iVar3 + 1;
            lVar13 = lVar13 + -1;
          } while (1 < lVar13);
        }
      }
      else {
        local_1578 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        if ((uVar26 >> 0xc & 1) == 0) {
          local_1578 = "0123456789abcdefghijklmnopqrstuvwxyz";
        }
        uVar12 = 1;
LAB_00102ba4:
        bVar28 = true;
        uVar11 = 0x10;
        bVar27 = false;
        bVar22 = 1;
LAB_0010301d:
        if (uVar24 == 0xffffffffffffffff) {
          uVar24 = 1;
        }
        if (uVar7 == 0) {
          lVar13 = 0xff;
          pbVar16 = &local_1439;
        }
        else {
          lVar13 = 0xff;
          do {
            lVar5 = lVar13;
            *(char *)((long)&local_1538 + lVar5) = local_1578[uVar7 % uVar11];
            lVar13 = lVar5 + -1;
            bVar1 = uVar11 <= uVar7;
            uVar7 = uVar7 / uVar11;
          } while (bVar1);
          pbVar16 = local_1558 + lVar5 + 0x1f;
        }
        lVar5 = uVar20 - (0xff - lVar13);
        sVar9 = uVar24 - (0xff - lVar13);
        if ((bVar27 && uVar12 != 0) && ((long)sVar9 < 1)) {
          lVar13 = lVar13 + -1;
          *pbVar16 = 0x30;
          lVar5 = lVar5 + -1;
        }
        else if (0 < (long)sVar9) {
          memset((void *)((long)&local_1438 - uVar24),0x30,sVar9);
          lVar5 = lVar5 - sVar9;
          lVar13 = 0xff - uVar24;
        }
        bVar22 = (byte)uVar12 & bVar22;
        lVar15 = lVar5 + -2;
        if (bVar22 == 0) {
          lVar15 = lVar5;
        }
        lVar15 = lVar15 - (ulong)(byte)(bVar28 ^ 1U | (uVar26 & 3) != 0);
        if ((uVar26 & 0x104) == 0) {
          if (lVar15 < 1) {
            lVar15 = lVar15 + -1;
          }
          else {
            iVar3 = iVar25 + (int)lVar15;
            do {
              iVar4 = (*stream)(0x20,(FILE *)data);
              if (iVar4 == -1) {
                return iVar25;
              }
              iVar25 = iVar25 + 1;
              lVar5 = lVar15 + -1;
              bVar27 = 0 < lVar15;
              lVar15 = lVar5;
            } while (lVar5 != 0 && bVar27);
            lVar15 = -1;
            iVar25 = iVar3;
          }
        }
        if (bVar28 == false) {
          iVar3 = 0x2d;
LAB_001031a9:
          iVar3 = (*stream)(iVar3,(FILE *)data);
          if (iVar3 == -1) {
            return iVar25;
          }
          iVar25 = iVar25 + 1;
        }
        else {
          if ((*(uint *)(auStack_1430 + lVar6 + -4) & 2) != 0) {
            iVar3 = 0x2b;
            goto LAB_001031a9;
          }
          if ((*(uint *)(auStack_1430 + lVar6 + -4) & 1) != 0) {
            iVar3 = 0x20;
            goto LAB_001031a9;
          }
        }
        if (bVar22 != 0) {
          iVar3 = (*stream)(0x30,(FILE *)data);
          if (iVar3 == -1) {
            return iVar25;
          }
          if ((auStack_1430[lVar6 + -3] & 0x10) == 0) {
            iVar3 = 0x78;
          }
          else {
            iVar3 = 0x58;
          }
          iVar3 = (*stream)(iVar3,(FILE *)data);
          if (iVar3 == -1) {
            return iVar25 + 1;
          }
          iVar25 = iVar25 + 2;
        }
        if ((*(uint *)(auStack_1430 + lVar6 + -4) & 0x104) == 0x100) {
          if (lVar15 < 1) {
            lVar15 = lVar15 + -1;
          }
          else {
            iVar3 = iVar25 + (int)lVar15;
            do {
              iVar4 = (*stream)(0x30,(FILE *)data);
              if (iVar4 == -1) {
                return iVar25;
              }
              iVar25 = iVar25 + 1;
              lVar5 = lVar15 + -1;
              bVar27 = 0 < lVar15;
              lVar15 = lVar5;
            } while (lVar5 != 0 && bVar27);
            lVar15 = -1;
            iVar25 = iVar3;
          }
        }
        iVar3 = iVar25;
        if (lVar13 < 0xff) {
          iVar3 = (iVar25 - (int)lVar13) + 0xff;
          do {
            iVar4 = (*stream)((int)*(undefined1 *)((long)&local_1538 + lVar13 + 1),(FILE *)data);
            if (iVar4 == -1) {
              return iVar25;
            }
            lVar13 = lVar13 + 1;
            iVar25 = iVar25 + 1;
          } while (lVar13 != 0xff);
        }
        iVar4 = iVar3;
        if (((auStack_1430[lVar6 + -4] & 4) != 0) && (0 < lVar15)) {
          iVar4 = iVar3 + (int)lVar15;
          lVar15 = lVar15 + 1;
          do {
            iVar25 = (*stream)(0x20,(FILE *)data);
            if (iVar25 == -1) {
              return iVar3;
            }
            iVar3 = iVar3 + 1;
            lVar15 = lVar15 + -1;
          } while (1 < lVar15);
        }
      }
      break;
    case 3:
      uVar7 = auStack_1418[lVar13 * 4 + -1];
      if ((uVar26 >> 0x11 & 1) == 0) {
        uVar12 = uVar26 >> 3 & 1;
        uVar11 = 10;
        if ((uVar26 >> 9 & 1) == 0) {
          if ((uVar26 >> 10 & 1) == 0) {
            if ((uVar26 >> 0xb & 1) != 0) {
              local_1578 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
              if ((uVar26 >> 0xc & 1) == 0) {
                local_1578 = "0123456789abcdefghijklmnopqrstuvwxyz";
              }
              goto LAB_00102ba4;
            }
            uVar8 = -uVar7;
            if (0 < (long)uVar7) {
              uVar8 = uVar7;
            }
            bVar28 = -1 < (long)uVar7;
            bVar27 = false;
            bVar22 = 0;
            uVar7 = uVar8;
          }
          else {
            uVar11 = 8;
            bVar28 = true;
            bVar22 = 0;
            bVar27 = true;
          }
        }
        else {
          bVar28 = true;
          bVar27 = false;
          bVar22 = 0;
        }
        goto LAB_0010301d;
      }
      if ((uVar26 & 4) == 0) {
        if ((long)uVar20 < 2) {
          uVar20 = uVar20 - 1;
        }
        else {
          iVar3 = iVar25 + iVar3;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) {
              return iVar25;
            }
            iVar25 = iVar25 + 1;
            uVar20 = uVar20 - 1;
          } while (1 < (long)uVar20);
          uVar20 = 0;
          iVar25 = iVar3 + -1;
        }
      }
      iVar3 = (*stream)((uint)uVar7 & 0xff,(FILE *)data);
      if (iVar3 == -1) {
        return iVar25;
      }
      iVar3 = iVar25 + 1;
      iVar4 = iVar3;
      if (((auStack_1430[lVar6 + -4] & 4) != 0) && (1 < (long)uVar20)) {
        lVar13 = uVar20 + 1;
        do {
          iVar4 = (*stream)(0x20,(FILE *)data);
          if (iVar4 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
          lVar13 = lVar13 + -1;
          iVar4 = iVar25 + (int)uVar20;
        } while (2 < lVar13);
      }
      break;
    case 4:
      if ((uVar26 & 0x40) != 0) {
        *(long *)auStack_1418[lVar13 * 4 + -1] = (long)iVar25;
        goto switchD_00102ada_caseD_5;
      }
      if ((uVar26 & 0x20) == 0) {
        if ((uVar26 & 0x10) == 0) {
          *(int *)auStack_1418[lVar13 * 4 + -1] = iVar25;
        }
        else {
          *(short *)auStack_1418[lVar13 * 4 + -1] = (short)iVar25;
        }
      }
      else {
        *(long *)auStack_1418[lVar13 * 4 + -1] = (long)iVar25;
      }
      break;
    default:
switchD_00102ada_caseD_5:
      break;
    case 7:
      local_1558[0x10] = 0;
      local_1558[0x11] = 0;
      local_1558[0x12] = 0;
      local_1558[0x13] = 0;
      local_1558[0x14] = 0;
      local_1558[0x15] = 0;
      local_1558[0x16] = 0;
      local_1558[0x17] = 0;
      local_1558[0x18] = 0;
      local_1558[0x19] = 0;
      local_1558[0x1a] = 0;
      local_1558[0x1b] = 0;
      local_1558[0x1c] = 0;
      local_1558[0x1d] = 0;
      local_1558[0x1e] = 0;
      local_1558[0x1f] = 0;
      local_1558[0] = 0x25;
      local_1558[1] = 0;
      local_1558[2] = 0;
      local_1558[3] = 0;
      local_1558[4] = 0;
      local_1558[5] = 0;
      local_1558[6] = 0;
      local_1558[7] = 0;
      local_1558[8] = 0;
      local_1558[9] = 0;
      local_1558[10] = 0;
      local_1558[0xb] = 0;
      local_1558[0xc] = 0;
      local_1558[0xd] = 0;
      local_1558[0xe] = 0;
      local_1558[0xf] = 0;
      sVar9 = strlen((char *)local_1558);
      if ((uVar26 >> 0xd & 1) == 0) {
        uVar20 = 0xffffffffffffffff;
        if ((uVar26 >> 0xe & 1) != 0) {
          puVar18 = auStack_1418 + *(long *)(auStack_1430 + lVar6) * 4 + -1;
          goto LAB_00102ca1;
        }
      }
      else {
        puVar18 = (ulong *)(auStack_1430 + lVar6);
LAB_00102ca1:
        uVar20 = *puVar18;
      }
      if ((short)uVar26 < 0) {
        puVar18 = &uStack_1428 + lVar13 * 4;
LAB_00102cd2:
        uVar24 = *puVar18;
      }
      else {
        uVar24 = 0xffffffffffffffff;
        if ((uVar26 >> 0x10 & 1) != 0) {
          puVar18 = auStack_1418 + (&uStack_1428)[lVar13 * 4] * 4 + -1;
          goto LAB_00102cd2;
        }
      }
      if ((uVar26 & 4) != 0) {
        sVar10 = strlen((char *)local_1558);
        (local_1558 + sVar10)[0] = 0x2d;
        (local_1558 + sVar10)[1] = 0;
      }
      if ((uVar26 & 2) != 0) {
        sVar10 = strlen((char *)local_1558);
        (local_1558 + sVar10)[0] = 0x2b;
        (local_1558 + sVar10)[1] = 0;
      }
      if ((uVar26 & 1) != 0) {
        sVar10 = strlen((char *)local_1558);
        (local_1558 + sVar10)[0] = 0x20;
        (local_1558 + sVar10)[1] = 0;
      }
      if ((uVar26 & 8) != 0) {
        sVar10 = strlen((char *)local_1558);
        (local_1558 + sVar10)[0] = 0x23;
        (local_1558 + sVar10)[1] = 0;
      }
      maxlength = 0x20 - sVar9;
      sVar9 = strlen((char *)local_1558);
      pbVar16 = local_1558 + sVar9;
      if (-1 < (long)uVar20) {
        iVar3 = curl_msnprintf((char *)pbVar16,maxlength,"%ld");
        pbVar16 = pbVar16 + iVar3;
        maxlength = maxlength - (long)iVar3;
      }
      if (-1 < (long)uVar24) {
        iVar3 = curl_msnprintf((char *)pbVar16,maxlength,".%ld");
        pbVar16 = pbVar16 + iVar3;
      }
      uVar26 = *(uint *)(auStack_1430 + lVar6 + -4);
      if ((uVar26 & 0x20) != 0) {
        *pbVar16 = 0x6c;
        pbVar16 = pbVar16 + 1;
        uVar26 = *(uint *)(auStack_1430 + lVar6 + -4);
      }
      if ((uVar26 >> 0x12 & 1) == 0) {
        bVar22 = 0x66;
        if ((uVar26 >> 0x13 & 1) != 0) {
          bVar22 = ((uVar26 >> 0xc & 1) == 0) << 5 | 0x47;
        }
      }
      else {
        bVar22 = ((uVar26 >> 0xc & 1) == 0) << 5 | 0x45;
      }
      *pbVar16 = bVar22;
      pbVar16[1] = 0;
      sprintf((char *)&local_1538,(char *)local_1558,(int)auStack_1418[lVar13 * 4 + -1]);
      pcVar14 = (char *)((long)&local_1538 + 1);
      cVar2 = (char)local_1538;
      while (iVar4 = iVar25, cVar2 != '\0') {
        iVar3 = (*stream)((int)cVar2,(FILE *)data);
        if (iVar3 == -1) {
          return iVar25;
        }
        iVar25 = iVar25 + 1;
        cVar2 = *pcVar14;
        pcVar14 = pcVar14 + 1;
      }
    }
    iVar25 = iVar4;
    format = (char *)*puVar19;
    puVar19 = puVar19 + 1;
    pcVar14 = format;
  } while( true );
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num=0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* Do the actual %-code parsing */
  dprintf_Pass1(format, vto, endpos, ap_save);

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param=dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM)
      width = (long)vto[p->width].data.num.as_signed;
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extraced from a parameter, we
                      must skip that to get to the next one properly */
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch (p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */
      {
        char *workend = &work[sizeof(work) - 1];
        char *w;

        /* Supply a default precision if none was given.  */
        if(prec == -1)
          prec = 1;

        /* Put the number in WORK.  */
        w = workend;
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        width -= (long)(workend - w);
        prec -= (long)(workend - w);

        if(is_alt && base == 8 && prec <= 0) {
          *w-- = '0';
          --width;
        }

        if(prec > 0) {
          width -= prec;
          while(prec-- > 0)
            *w-- = '0';
        }

        if(is_alt && base == 16)
          width -= 2;

        if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
          --width;

        if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR(' ');

        if(is_neg)
          OUTCHAR('-');
        else if(p->flags & FLAGS_SHOWSIGN)
          OUTCHAR('+');
        else if(p->flags & FLAGS_SPACE)
          OUTCHAR(' ');

        if(is_alt && base == 16) {
          OUTCHAR('0');
          if(p->flags & FLAGS_UPPER)
            OUTCHAR('X');
          else
            OUTCHAR('x');
        }

        if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR('0');

        /* Write the number.  */
        while(++w <= workend) {
          OUTCHAR(*w);
        }

        if(p->flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else
          len = strlen(str);

        if(prec != -1 && (size_t) prec < len)
          len = (size_t)prec;
        width -= (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        while(len-- > 0)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr;
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          strcat(formatbuf, "-");
        if(p->flags & FLAGS_SHOWSIGN)
          strcat(formatbuf, "+");
        if(p->flags & FLAGS_SPACE)
          strcat(formatbuf, " ");
        if(p->flags & FLAGS_ALT)
          strcat(formatbuf, "#");

        fptr=&formatbuf[strlen(formatbuf)];

        if(width >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf() implementations returns number
           of output characters */
        (sprintf)(work, formatbuf, p->data.dnum);

        for(fptr=work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}